

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall
testing::internal::
scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
reset(scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != p) {
    if (this_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    operator_delete(this_00);
    this->ptr_ = p;
  }
  return;
}

Assistant:

void reset(T* p = NULL) {
                if (p != ptr_) {
                    if (IsTrue(sizeof(T) > 0)) {  // Makes sure T is a complete type.
                        delete ptr_;
                    }
                    ptr_ = p;
                }
            }